

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

int onig_get_capture_range_in_callout(OnigCalloutArgs *a,int mem_num,int *begin,int *end)

{
  OnigRegex pOVar1;
  StackType *pSVar2;
  uint uVar3;
  StkPtrType *pSVar4;
  int iVar5;
  StkPtrType *pSVar6;
  
  if (0 < mem_num) {
    if (a->mem_end_stk[(uint)mem_num].i == -1) {
      *end = -1;
      *begin = -1;
    }
    else {
      pOVar1 = a->regex;
      pSVar2 = a->stk_base;
      uVar3 = 1 << ((byte)mem_num & 0x1f);
      if (0x1f < (uint)mem_num) {
        uVar3 = 1;
      }
      pSVar6 = a->mem_start_stk + (uint)mem_num;
      if ((pOVar1->push_mem_start & uVar3) != 0) {
        pSVar6 = (StkPtrType *)&pSVar2[pSVar6->i].u;
      }
      pSVar4 = a->mem_end_stk + (uint)mem_num;
      uVar3 = 1 << ((byte)mem_num & 0x1f);
      iVar5 = (int)a->string;
      *begin = *(int *)pSVar6 - iVar5;
      if (0x1f < (uint)mem_num) {
        uVar3 = 1;
      }
      if ((pOVar1->push_mem_end & uVar3) != 0) {
        pSVar4 = (StkPtrType *)&pSVar2[pSVar4->i].u;
      }
      *end = *(int *)pSVar4 - iVar5;
    }
    return 0;
  }
  return -0x1e;
}

Assistant:

extern int
onig_get_capture_range_in_callout(OnigCalloutArgs* a, int mem_num, int* begin, int* end)
{
  OnigRegex    reg;
  const UChar* str;
  StackType*   stk_base;
  int i;
  StkPtrType* mem_start_stk;
  StkPtrType* mem_end_stk;

  i = mem_num;
  reg = a->regex;
  str = a->string;
  stk_base = a->stk_base;
  mem_start_stk = a->mem_start_stk;
  mem_end_stk   = a->mem_end_stk;

  if (i > 0) {
    if (a->mem_end_stk[i].i != INVALID_STACK_INDEX) {
      *begin = (int )(STACK_MEM_START(reg, i) - str);
      *end   = (int )(STACK_MEM_END(reg, i)   - str);
    }
    else {
      *begin = *end = ONIG_REGION_NOTPOS;
    }
  }
  else
    return ONIGERR_INVALID_ARGUMENT;

  return ONIG_NORMAL;
}